

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool DescendantOf(Node *element,TidyTagId tid)

{
  Node *local_28;
  Node *parent;
  TidyTagId tid_local;
  Node *element_local;
  
  local_28 = element->parent;
  while( true ) {
    if (local_28 == (Node *)0x0) {
      return no;
    }
    if (((local_28 != (Node *)0x0) && (local_28->tag != (Dict *)0x0)) && (local_28->tag->id == tid))
    break;
    local_28 = local_28->parent;
  }
  return yes;
}

Assistant:

static Bool DescendantOf( Node *element, TidyTagId tid )
{
    Node *parent;
    for ( parent = element->parent;
          parent != NULL;
          parent = parent->parent )
    {
        if ( TagIsId(parent, tid) )
            return yes;
    }
    return no;
}